

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void __thiscall RtApi::convertBuffer(RtApi *this,char *outBuffer,char *inBuffer,ConvertInfo *info)

{
  char cVar1;
  byte bVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  pointer piVar7;
  pointer piVar8;
  uint i;
  uint uVar9;
  RtAudioFormat RVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint i_4;
  uint uVar17;
  Float64 *in_1;
  long lVar18;
  
  if ((((this->stream_).deviceBuffer == outBuffer) && ((this->stream_).mode == DUPLEX)) &&
     (iVar4 = info->outJump, info->inJump < iVar4)) {
    uVar17 = (this->stream_).bufferSize;
    uVar9 = formatBytes(this,info->outFormat);
    memset(outBuffer,0,(ulong)(iVar4 * uVar17 * uVar9));
  }
  RVar10 = info->outFormat;
  switch(RVar10) {
  case 1:
    RVar10 = info->inFormat;
    if (RVar10 == 1) {
      pcVar12 = inBuffer;
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18]] =
               pcVar12[(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18]];
        }
        pcVar12 = pcVar12 + info->inJump;
        outBuffer = outBuffer + info->outJump;
      }
      RVar10 = info->inFormat;
    }
    if (RVar10 == 2) {
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18]] =
               inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar18] * 2 + 1];
        }
        inBuffer = inBuffer + (long)info->inJump * 2;
        outBuffer = outBuffer + info->outJump;
      }
    }
    else if (RVar10 == 4) {
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18]] =
               inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar18] * 4 + 2];
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + info->outJump;
      }
    }
    else if (RVar10 == 8) {
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18]] =
               inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar18] * 4 + 3];
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + info->outJump;
      }
    }
    else if (RVar10 == 0x10) {
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          lVar11 = llroundf(*(float *)(inBuffer +
                                      (long)(info->inOffset).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar18] * 4) * 128.0);
          if (0x7e < lVar11) {
            lVar11 = 0x7f;
          }
          if (lVar11 < -0x7f) {
            lVar11 = -0x80;
          }
          outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18]] = (char)lVar11;
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + info->outJump;
      }
    }
    else if (RVar10 == 0x20) {
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          lVar11 = llround(*(double *)
                            (inBuffer +
                            (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar18] * 8) * 128.0);
          if (0x7e < lVar11) {
            lVar11 = 0x7f;
          }
          if (lVar11 < -0x7f) {
            lVar11 = -0x80;
          }
          outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar18]] = (char)lVar11;
        }
        inBuffer = inBuffer + (long)info->inJump * 8;
        outBuffer = outBuffer + info->outJump;
      }
    }
    break;
  case 2:
    RVar10 = info->inFormat;
    switch(RVar10) {
    case 1:
      uVar17 = (this->stream_).bufferSize;
      iVar4 = info->inJump;
      iVar5 = info->outJump;
      uVar15 = 0;
      uVar14 = (ulong)(uint)info->channels;
      if (info->channels < 1) {
        uVar14 = uVar15;
      }
      for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          *(ushort *)(outBuffer + (long)piVar8[uVar16] * 2) =
               (ushort)(byte)inBuffer[piVar7[uVar16]] << 8;
        }
        inBuffer = inBuffer + iVar4;
        outBuffer = outBuffer + (long)iVar5 * 2;
      }
      break;
    case 2:
      uVar17 = (this->stream_).bufferSize;
      iVar4 = info->inJump;
      iVar5 = info->outJump;
      uVar15 = 0;
      uVar14 = (ulong)(uint)info->channels;
      if (info->channels < 1) {
        uVar14 = uVar15;
      }
      for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          *(undefined2 *)(outBuffer + (long)piVar8[uVar16] * 2) =
               *(undefined2 *)(inBuffer + (long)piVar7[uVar16] * 2);
        }
        inBuffer = inBuffer + (long)iVar4 * 2;
        outBuffer = outBuffer + (long)iVar5 * 2;
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      uVar17 = (this->stream_).bufferSize;
      iVar4 = info->inJump;
      iVar5 = info->outJump;
      uVar15 = 0;
      uVar14 = (ulong)(uint)info->channels;
      if (info->channels < 1) {
        uVar14 = uVar15;
      }
      for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          lVar18 = (long)piVar7[uVar16];
          *(short *)(outBuffer + (long)piVar8[uVar16] * 2) =
               (short)(CONCAT12(inBuffer[lVar18 * 4 + 2],*(undefined2 *)(inBuffer + lVar18 * 4)) >>
                      8);
        }
        inBuffer = inBuffer + (long)iVar4 * 4;
        outBuffer = outBuffer + (long)iVar5 * 2;
      }
      break;
    case 8:
      uVar17 = (this->stream_).bufferSize;
      iVar4 = info->inJump;
      iVar5 = info->outJump;
      uVar15 = 0;
      uVar14 = (ulong)(uint)info->channels;
      if (info->channels < 1) {
        uVar14 = uVar15;
      }
      for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          *(undefined2 *)(outBuffer + (long)piVar8[uVar16] * 2) =
               *(undefined2 *)(inBuffer + (long)piVar7[uVar16] * 4 + 2);
        }
        inBuffer = inBuffer + (long)iVar4 * 4;
        outBuffer = outBuffer + (long)iVar5 * 2;
      }
      break;
    default:
      if (RVar10 == 0x10) {
        for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
          for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
            lVar11 = llroundf(*(float *)(inBuffer +
                                        (long)(info->inOffset).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar18] * 4) *
                              32768.0);
            if (0x7ffe < lVar11) {
              lVar11 = 0x7fff;
            }
            if (lVar11 < -0x7fff) {
              lVar11 = -0x8000;
            }
            *(short *)(outBuffer +
                      (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar18] * 2) = (short)lVar11;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 2;
        }
      }
      else if (RVar10 == 0x20) {
        for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
          for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
            lVar11 = llround(*(double *)
                              (inBuffer +
                              (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar18] * 8) * 32768.0)
            ;
            if (0x7ffe < lVar11) {
              lVar11 = 0x7fff;
            }
            if (lVar11 < -0x7fff) {
              lVar11 = -0x8000;
            }
            *(short *)(outBuffer +
                      (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar18] * 2) = (short)lVar11;
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 2;
        }
      }
    }
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
    RVar10 = info->inFormat;
    switch(RVar10) {
    case 1:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          cVar1 = inBuffer[(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18]];
          lVar11 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18];
          (outBuffer + lVar11 * 4)[0] = '\0';
          (outBuffer + lVar11 * 4)[1] = '\0';
          outBuffer[lVar11 * 4 + 2] = cVar1;
        }
        inBuffer = inBuffer + info->inJump;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    case 2:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          uVar3 = *(undefined2 *)
                   (inBuffer +
                   (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18] * 2);
          lVar11 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18];
          outBuffer[lVar11 * 4] = '\0';
          outBuffer[lVar11 * 4 + 1] = (char)uVar3;
          outBuffer[lVar11 * 4 + 2] = (char)((ushort)uVar3 >> 8);
        }
        inBuffer = inBuffer + (long)info->inJump * 2;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          *(undefined4 *)
           (outBuffer +
           (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18] * 4) =
               *(undefined4 *)
                (inBuffer +
                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18] * 4);
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    case 8:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          uVar6 = *(undefined4 *)
                   (inBuffer +
                   (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18] * 4);
          lVar11 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18];
          outBuffer[lVar11 * 4] = (char)((uint)uVar6 >> 8);
          outBuffer[lVar11 * 4 + 1] = (char)((uint)uVar6 >> 0x10);
          outBuffer[lVar11 * 4 + 2] = (char)((uint)uVar6 >> 0x18);
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    default:
      if (RVar10 == 0x10) {
        for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
          for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
            lVar11 = llroundf(*(float *)(inBuffer +
                                        (long)(info->inOffset).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar18] * 4) *
                              8388608.0);
            if (0x7ffffe < lVar11) {
              lVar11 = 0x7fffff;
            }
            if (lVar11 < -0x7fffff) {
              lVar11 = -0x800000;
            }
            lVar13 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18];
            outBuffer[lVar13 * 4] = (char)lVar11;
            outBuffer[lVar13 * 4 + 1] = (char)((ulong)lVar11 >> 8);
            outBuffer[lVar13 * 4 + 2] = (char)((ulong)lVar11 >> 0x10);
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
        }
      }
      else if (RVar10 == 0x20) {
        for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
          for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
            lVar11 = llround(*(double *)
                              (inBuffer +
                              (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar18] * 8) *
                             8388608.0);
            if (0x7ffffe < lVar11) {
              lVar11 = 0x7fffff;
            }
            if (lVar11 < -0x7fffff) {
              lVar11 = -0x800000;
            }
            lVar13 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18];
            outBuffer[lVar13 * 4] = (char)lVar11;
            outBuffer[lVar13 * 4 + 1] = (char)((ulong)lVar11 >> 8);
            outBuffer[lVar13 * 4 + 2] = (char)((ulong)lVar11 >> 0x10);
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 4;
        }
      }
    }
    break;
  case 8:
    RVar10 = info->inFormat;
    switch(RVar10) {
    case 1:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          *(int *)(outBuffer + (long)piVar8[lVar18] * 4) = (int)inBuffer[piVar7[lVar18]];
          *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
               *(int *)(outBuffer + (long)piVar8[lVar18] * 4) << 0x18;
        }
        inBuffer = inBuffer + info->inJump;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    case 2:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
               (int)*(short *)(inBuffer + (long)piVar7[lVar18] * 2);
          *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
               *(int *)(outBuffer + (long)piVar8[lVar18] * 4) << 0x10;
        }
        inBuffer = inBuffer + (long)info->inJump * 2;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          lVar11 = (long)piVar7[lVar18];
          bVar2 = inBuffer[lVar11 * 4 + 2];
          uVar9 = ((uint)*(ushort *)(inBuffer + lVar11 * 4) + (uint)bVar2 * 0x10000) - 0x1000000;
          if (-1 < (char)bVar2) {
            uVar9 = (uint)CONCAT12(bVar2,*(ushort *)(inBuffer + lVar11 * 4));
          }
          *(uint *)(outBuffer + (long)piVar8[lVar18] * 4) = uVar9;
          *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
               *(int *)(outBuffer + (long)piVar8[lVar18] * 4) << 8;
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    case 8:
      for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
          *(undefined4 *)(outBuffer + (long)piVar8[lVar18] * 4) =
               *(undefined4 *)(inBuffer + (long)piVar7[lVar18] * 4);
        }
        inBuffer = inBuffer + (long)info->inJump * 4;
        outBuffer = outBuffer + (long)info->outJump * 4;
      }
      break;
    default:
      if (RVar10 == 0x10) {
        for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
          for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
            lVar11 = llroundf(*(float *)(inBuffer +
                                        (long)(info->inOffset).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar18] * 4) *
                              2.1474836e+09);
            if (0x7ffffffe < lVar11) {
              lVar11 = 0x7fffffff;
            }
            if (lVar11 < -0x7fffffff) {
              lVar11 = -0x80000000;
            }
            *(int *)(outBuffer +
                    (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18] * 4) = (int)lVar11;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
        }
      }
      else if (RVar10 == 0x20) {
        for (uVar17 = 0; uVar17 < (this->stream_).bufferSize; uVar17 = uVar17 + 1) {
          for (lVar18 = 0; lVar18 < info->channels; lVar18 = lVar18 + 1) {
            lVar11 = llround(*(double *)
                              (inBuffer +
                              (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar18] * 8) *
                             2147483648.0);
            if (0x7ffffffe < lVar11) {
              lVar11 = 0x7fffffff;
            }
            if (lVar11 < -0x7fffffff) {
              lVar11 = -0x80000000;
            }
            *(int *)(outBuffer +
                    (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18] * 4) = (int)lVar11;
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 4;
        }
      }
    }
    break;
  default:
    if (RVar10 == 0x10) {
      RVar10 = info->inFormat;
      switch(RVar10) {
      case 1:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)(outBuffer + (long)piVar8[uVar16] * 4) =
                 (float)(int)inBuffer[piVar7[uVar16]] * 0.0078125;
          }
          inBuffer = inBuffer + iVar4;
          outBuffer = outBuffer + (long)iVar5 * 4;
        }
        break;
      case 2:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)(outBuffer + (long)piVar8[uVar16] * 4) =
                 (float)(int)*(short *)(inBuffer + (long)piVar7[uVar16] * 2) * 3.0517578e-05;
          }
          inBuffer = inBuffer + (long)iVar4 * 2;
          outBuffer = outBuffer + (long)iVar5 * 4;
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            lVar18 = (long)piVar7[uVar16];
            bVar2 = inBuffer[lVar18 * 4 + 2];
            uVar9 = ((uint)*(ushort *)(inBuffer + lVar18 * 4) + (uint)bVar2 * 0x10000) - 0x1000000;
            if (-1 < (char)bVar2) {
              uVar9 = (uint)CONCAT12(bVar2,*(ushort *)(inBuffer + lVar18 * 4));
            }
            *(float *)(outBuffer + (long)piVar8[uVar16] * 4) = (float)(int)uVar9 * 1.1920929e-07;
          }
          inBuffer = inBuffer + (long)iVar4 * 4;
          outBuffer = outBuffer + (long)iVar5 * 4;
        }
        break;
      case 8:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)(outBuffer + (long)piVar8[uVar16] * 4) =
                 (float)*(int *)(inBuffer + (long)piVar7[uVar16] * 4) * 4.656613e-10;
          }
          inBuffer = inBuffer + (long)iVar4 * 4;
          outBuffer = outBuffer + (long)iVar5 * 4;
        }
        break;
      default:
        if (RVar10 == 0x10) {
          uVar17 = (this->stream_).bufferSize;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar15 = 0;
          uVar14 = (ulong)(uint)info->channels;
          if (info->channels < 1) {
            uVar14 = uVar15;
          }
          for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
              *(undefined4 *)(outBuffer + (long)piVar8[uVar16] * 4) =
                   *(undefined4 *)(inBuffer + (long)piVar7[uVar16] * 4);
            }
            inBuffer = inBuffer + (long)iVar4 * 4;
            outBuffer = outBuffer + (long)iVar5 * 4;
          }
        }
        else if (RVar10 == 0x20) {
          uVar17 = (this->stream_).bufferSize;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar15 = 0;
          uVar14 = (ulong)(uint)info->channels;
          if (info->channels < 1) {
            uVar14 = uVar15;
          }
          for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)(outBuffer + (long)piVar8[uVar16] * 4) =
                   (float)*(double *)(inBuffer + (long)piVar7[uVar16] * 8);
            }
            inBuffer = inBuffer + (long)iVar4 * 8;
            outBuffer = outBuffer + (long)iVar5 * 4;
          }
        }
      }
    }
    else if (RVar10 == 0x20) {
      RVar10 = info->inFormat;
      switch(RVar10) {
      case 1:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(double *)(outBuffer + (long)piVar8[uVar16] * 8) =
                 (double)(int)inBuffer[piVar7[uVar16]] * 0.0078125;
          }
          inBuffer = inBuffer + iVar4;
          outBuffer = outBuffer + (long)iVar5 * 8;
        }
        break;
      case 2:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(double *)(outBuffer + (long)piVar8[uVar16] * 8) =
                 (double)(int)*(short *)(inBuffer + (long)piVar7[uVar16] * 2) * 3.0517578125e-05;
          }
          inBuffer = inBuffer + (long)iVar4 * 2;
          outBuffer = outBuffer + (long)iVar5 * 8;
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            lVar18 = (long)piVar7[uVar16];
            bVar2 = inBuffer[lVar18 * 4 + 2];
            uVar9 = ((uint)*(ushort *)(inBuffer + lVar18 * 4) + (uint)bVar2 * 0x10000) - 0x1000000;
            if (-1 < (char)bVar2) {
              uVar9 = (uint)CONCAT12(bVar2,*(ushort *)(inBuffer + lVar18 * 4));
            }
            *(double *)(outBuffer + (long)piVar8[uVar16] * 8) =
                 (double)(int)uVar9 * 1.1920928955078125e-07;
          }
          inBuffer = inBuffer + (long)iVar4 * 4;
          outBuffer = outBuffer + (long)iVar5 * 8;
        }
        break;
      case 8:
        uVar17 = (this->stream_).bufferSize;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar15 = 0;
        uVar14 = (ulong)(uint)info->channels;
        if (info->channels < 1) {
          uVar14 = uVar15;
        }
        for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(double *)(outBuffer + (long)piVar8[uVar16] * 8) =
                 (double)*(int *)(inBuffer + (long)piVar7[uVar16] * 4) * 4.656612873077393e-10;
          }
          inBuffer = inBuffer + (long)iVar4 * 4;
          outBuffer = outBuffer + (long)iVar5 * 8;
        }
        break;
      default:
        if (RVar10 == 0x10) {
          uVar17 = (this->stream_).bufferSize;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar15 = 0;
          uVar14 = (ulong)(uint)info->channels;
          if (info->channels < 1) {
            uVar14 = uVar15;
          }
          for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
              *(double *)(outBuffer + (long)piVar8[uVar16] * 8) =
                   (double)*(float *)(inBuffer + (long)piVar7[uVar16] * 4);
            }
            inBuffer = inBuffer + (long)iVar4 * 4;
            outBuffer = outBuffer + (long)iVar5 * 8;
          }
        }
        else if (RVar10 == 0x20) {
          uVar17 = (this->stream_).bufferSize;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar15 = 0;
          uVar14 = (ulong)(uint)info->channels;
          if (info->channels < 1) {
            uVar14 = uVar15;
          }
          for (; (uint)uVar15 != uVar17; uVar15 = (ulong)((uint)uVar15 + 1)) {
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
              *(undefined8 *)(outBuffer + (long)piVar8[uVar16] * 8) =
                   *(undefined8 *)(inBuffer + (long)piVar7[uVar16] * 8);
            }
            inBuffer = inBuffer + (long)iVar4 * 8;
            outBuffer = outBuffer + (long)iVar5 * 8;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RtApi :: convertBuffer( char *outBuffer, char *inBuffer, ConvertInfo &info )
{
  // This function does format conversion, input/output channel compensation, and
  // data interleaving/deinterleaving.  24-bit integers are assumed to occupy
  // the lower three bytes of a 32-bit integer.

  // Clear our duplex device output buffer if there are more device outputs than user outputs
  if ( outBuffer == stream_.deviceBuffer && stream_.mode == DUPLEX && info.outJump > info.inJump )
    memset( outBuffer, 0, stream_.bufferSize * info.outJump * formatBytes( info.outFormat ) );

  int j;
  if (info.outFormat == RTAUDIO_FLOAT64) {
    Float64 *out = (Float64 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 128.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 32768.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]].asInt() / 8388608.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 2147483648.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      // Channel compensation and/or (de)interleaving only.
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_FLOAT32) {
    Float32 *out = (Float32 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 128.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 32768.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]].asInt() / 8388608.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 2147483648.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      // Channel compensation and/or (de)interleaving only.
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT32) {
    Int32 *out = (Int32 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 24;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]].asInt();
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      // Channel compensation and/or (de)interleaving only.
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          // Use llround() which returns `long long` which is guaranteed to be at least 64 bits.
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.f), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.0), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT24) {
    Int24 *out = (Int24 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 16);
          //out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 8);
          //out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      // Channel compensation and/or (de)interleaving only.
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] >> 8);
          //out[info.outOffset[j]] >>= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.f), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.0), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT16) {
    Int16 *out = (Int16 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      // Channel compensation and/or (de)interleaving only.
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) (in[info.inOffset[j]].asInt() >> 8);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) ((in[info.inOffset[j]] >> 16) & 0x0000ffff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.f), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.0), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT8) {
    signed char *out = (signed char *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      // Channel compensation and/or (de)interleaving only.
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 8) & 0x00ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) (in[info.inOffset[j]].asInt() >> 16);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 24) & 0x000000ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.f), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.0), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
}